

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O2

int __thiscall
bdHashSet::search(bdHashSet *this,string *key,uint32_t maxAge,
                 list<bdHashEntry,_std::allocator<bdHashEntry>_> *entries)

{
  iterator iVar1;
  iterator iVar2;
  time_t tVar3;
  _Self __tmp;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
          ::lower_bound(&(this->mEntries)._M_t,key);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
          ::upper_bound(&(this->mEntries)._M_t,key);
  tVar3 = time((time_t *)0x0);
  for (; iVar1._M_node != iVar2._M_node;
      iVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node)) {
    if (tVar3 - *(long *)(iVar1._M_node + 3) < (long)(int)maxAge) {
      std::__cxx11::list<bdHashEntry,_std::allocator<bdHashEntry>_>::push_back
                (entries,(value_type *)(iVar1._M_node + 2));
    }
  }
  return (int)(*(long *)(entries + 0x10) != 0);
}

Assistant:

int 	bdHashSet::search(std::string key, uint32_t maxAge, std::list<bdHashEntry> &entries) {
	std::multimap<std::string, bdHashEntry>::iterator sit, eit, it;
        sit = mEntries.lower_bound(key);
        eit = mEntries.upper_bound(key);

	time_t now = time(NULL);

	for (it = sit; it != eit; it++) {
		time_t age = now - it->second.mStoreTS;
		if (age < (int32_t) maxAge) {
			entries.push_back(it->second);
		}
	}
	return (0 < entries.size());
}